

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O1

fdb_status
compactor_get_actual_filename
          (char *filename,char *actual_filename,fdb_compaction_mode_t comp_mode,
          err_log_callback *log_callback)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  compactor_meta *pcVar4;
  size_t sVar5;
  DIR *__dirp;
  dirent *pdVar6;
  uint uVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  err_log_callback *log_callback_00;
  int compaction_no;
  char dirname [1024];
  char ret_name [1024];
  char prefix [1024];
  compactor_meta meta;
  char path [1024];
  uint local_1458;
  undefined4 local_1454;
  char *local_1450;
  stat local_1448 [7];
  char local_1048 [1024];
  char local_c48 [1032];
  compactor_meta local_840;
  char local_438 [1032];
  
  sprintf(local_438,"%s.meta",filename);
  pcVar4 = _compactor_read_metafile(local_438,&local_840,log_callback_00);
  if (pcVar4 == (compactor_meta *)0x0) {
    if ((comp_mode == '\0') && (iVar2 = stat(filename,local_1448), iVar2 == 0)) goto LAB_00119d9a;
    sVar5 = strlen(filename);
    uVar8 = sVar5 & 0xffffffff;
    uVar3 = (int)sVar5 + 1;
    do {
      if ((int)uVar8 < 1) {
        uVar3 = 0;
        break;
      }
      uVar3 = uVar3 - 1;
      lVar1 = uVar8 - 1;
      uVar8 = uVar8 - 1;
    } while (filename[lVar1] != '/');
    uVar8 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      local_1448[0].st_dev._0_2_ = 0x2e;
    }
    else {
      strncpy((char *)local_1448,filename,uVar8);
      *(undefined1 *)((long)local_1448[0].__unused + (uVar8 - 0x78)) = 0;
    }
    strcpy(local_c48,filename + uVar8);
    sVar5 = strlen(local_c48);
    (local_c48 + sVar5)[0] = '.';
    (local_c48 + sVar5)[1] = '\0';
    __dirp = opendir((char *)local_1448);
    if (__dirp == (DIR *)0x0) {
      uVar3 = 0xffffffff;
    }
    else {
      local_1454 = (undefined4)CONCAT71(in_register_00000011,comp_mode);
      local_1450 = actual_filename;
      pdVar6 = readdir(__dirp);
      if (pdVar6 == (dirent *)0x0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = 0xffffffff;
        do {
          sVar5 = strlen(local_c48);
          iVar2 = strncmp(pdVar6->d_name,local_c48,sVar5);
          if (iVar2 == 0) {
            local_1458 = 0xffffffff;
            __isoc99_sscanf(pdVar6->d_name + sVar5,"%d",&local_1458);
            uVar7 = uVar3;
            if ((int)uVar3 < (int)local_1458) {
              uVar7 = local_1458;
            }
            if (-1 < (int)local_1458) {
              uVar3 = uVar7;
            }
          }
          pdVar6 = readdir(__dirp);
        } while (pdVar6 != (dirent *)0x0);
      }
      closedir(__dirp);
      comp_mode = (fdb_compaction_mode_t)local_1454;
      actual_filename = local_1450;
    }
    if ((int)uVar3 < 0) {
      if (comp_mode != '\x01') goto LAB_00119d9a;
      sprintf(local_1048,"%s.0",filename);
    }
    else {
      sprintf(local_1048,"%s.%d",filename,(ulong)uVar3);
    }
  }
  else {
    _reconstruct_path(local_1048,filename,local_840.filename);
  }
  filename = local_1048;
LAB_00119d9a:
  strcpy(actual_filename,filename);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status compactor_get_actual_filename(const char *filename,
                                         char *actual_filename,
                                         fdb_compaction_mode_t comp_mode,
                                         err_log_callback *log_callback)
{
    int i;
    int filename_len;
    int dirname_len;
    int compaction_no, max_compaction_no = -1;
    char path[MAX_FNAMELEN];
    char dirname[MAX_FNAMELEN], prefix[MAX_FNAMELEN];
    char ret_name[MAX_FNAMELEN];
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct compactor_meta meta, *meta_ptr;

    // get actual filename from metafile
    sprintf(path, "%s.meta", filename);
    meta_ptr = _compactor_read_metafile(path, &meta, log_callback);

    if (meta_ptr == NULL) {
        if (comp_mode == FDB_COMPACTION_MANUAL && does_file_exist(filename)) {
            strcpy(actual_filename, filename);
            return FDB_RESULT_SUCCESS;
        }

        // error handling .. scan directory
        // backward search until find the first '/' or '\' (Windows)
        filename_len = strlen(filename);
        dirname_len = 0;

#if !defined(WIN32) && !defined(_WIN32)
        DIR *dir_info;
        struct dirent *dir_entry;

        for (i=filename_len-1; i>=0; --i){
            if (filename[i] == '/') {
                dirname_len = i+1;
                break;
            }
        }

        if (dirname_len > 0) {
            strncpy(dirname, filename, dirname_len);
            dirname[dirname_len] = 0;
        } else {
            strcpy(dirname, ".");
        }
        strcpy(prefix, filename + dirname_len);
        strcat(prefix, ".");

        dir_info = opendir(dirname);
        if (dir_info != NULL) {
            while ((dir_entry = readdir(dir_info))) {
                if (!strncmp(dir_entry->d_name, prefix, strlen(prefix))) {
                    compaction_no = -1;
                    sscanf(dir_entry->d_name + strlen(prefix), "%d", &compaction_no);
                    if (compaction_no >= 0) {
                        if (compaction_no > max_compaction_no) {
                            max_compaction_no = compaction_no;
                        }
                    }
                }
            }
            closedir(dir_info);
        }
#else
        // Windows
        for (i=filename_len-1; i>=0; --i){
            if (filename[i] == '/' || filename[i] == '\\') {
                dirname_len = i+1;
                break;
            }
        }

        if (dirname_len > 0) {
            strncpy(dirname, filename, dirname_len);
            dirname[dirname_len] = 0;
        } else {
            strcpy(dirname, ".");
        }
        strcpy(prefix, filename + dirname_len);
        strcat(prefix, ".");

        WIN32_FIND_DATA filedata;
        HANDLE hfind;
        char query_str[MAX_FNAMELEN];

        // find all files start with 'prefix'
        sprintf(query_str, "%s*", prefix);
        hfind = FindFirstFile(query_str, &filedata);
        while (hfind != INVALID_HANDLE_VALUE) {
            if (!strncmp(filedata.cFileName, prefix, strlen(prefix))) {
                compaction_no = -1;
                sscanf(filedata.cFileName + strlen(prefix), "%d", &compaction_no);
                if (compaction_no >= 0) {
                    if (compaction_no > max_compaction_no) {
                        max_compaction_no = compaction_no;
                    }
                }
            }

            if (!FindNextFile(hfind, &filedata)) {
                FindClose(hfind);
                hfind = INVALID_HANDLE_VALUE;
            }
        }

#endif

        if (max_compaction_no < 0) {
            if (comp_mode == FDB_COMPACTION_AUTO) {
                // DB files with a revision number are not found.
                // initialize filename to '[filename].0'
                sprintf(ret_name, "%s.0", filename);
            } else { // Manual compaction mode.
                // Simply use the file name passed to this function.
                strcpy(actual_filename, filename);
                return FDB_RESULT_SUCCESS;
            }
        } else {
            // return the file that has the largest compaction number
            sprintf(ret_name, "%s.%d", filename, max_compaction_no);
            fs = FDB_RESULT_SUCCESS;
        }
        if (fs == FDB_RESULT_SUCCESS) {
            strcpy(actual_filename, ret_name);
        }
        return fs;

    } else {
        // metadata is successfully read from the metafile .. just return the filename
        _reconstruct_path(ret_name, (char*)filename, meta.filename);
        strcpy(actual_filename, ret_name);
        return FDB_RESULT_SUCCESS;
    }
}